

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_simd_2_24_unconditional(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  float *pfVar21;
  int iVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  uint uVar26;
  ulong uVar27;
  float *pfVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar52 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar73 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [64];
  float fVar75;
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  float fVar79;
  undefined1 auVar80 [32];
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM17 [64];
  int local_84;
  
  pfVar31 = haarResponseY;
  pfVar23 = haarResponseX;
  auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x3effffff));
  auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar78._32_32_ = in_ZmmResult._32_32_;
  auVar78._0_32_ = vpbroadcastd_avx512vl(ZEXT416((uint)ipoint->scale));
  auVar77 = vpcmpeqd_avx2(in_ZMM13._0_32_,in_ZMM13._0_32_);
  lVar18 = 0xa0;
  auVar73._16_48_ = auVar78._16_48_;
  auVar37 = vmovdqa64_avx512vl(auVar35);
  auVar37 = vpternlogd_avx512vl(auVar37,ZEXT416((uint)ipoint->y),auVar36,0xf8);
  auVar38 = vmovdqa64_avx512vl(auVar35);
  auVar51 = auVar78._0_16_;
  auVar38 = vpternlogd_avx512vl(auVar38,auVar51,auVar36,0xf8);
  auVar39 = vmovdqa64_avx512vl(auVar35);
  auVar39 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)ipoint->x),auVar36,0xf8);
  auVar40 = vmulss_avx512f(auVar51,auVar51);
  auVar38 = vaddss_avx512f(auVar51,auVar38);
  auVar73._0_16_ = vcvtss2sd_avx512f(auVar51,auVar51);
  auVar74._0_8_ = auVar73._0_8_;
  auVar74._8_56_ = auVar73._8_56_;
  auVar37 = ZEXT416((uint)(auVar37._0_4_ + ipoint->y));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + ipoint->x));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar42._0_8_ = (double)auVar37._0_4_;
  auVar42._8_8_ = auVar37._8_8_;
  auVar37._0_4_ = (int)auVar38._0_4_;
  auVar37._4_4_ = (int)auVar38._4_4_;
  auVar37._8_4_ = (int)auVar38._8_4_;
  auVar37._12_4_ = (int)auVar38._12_4_;
  auVar41._0_8_ = (double)auVar39._0_4_;
  auVar41._8_8_ = auVar39._8_8_;
  auVar38 = vfmadd231sd_fma(auVar42,auVar74._0_16_,ZEXT816(0x3fe0000000000000));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar39 = vfmadd231sd_fma(auVar41,auVar74._0_16_,ZEXT816(0x3fe0000000000000));
  auVar52 = vmulps_avx512vl(auVar78._0_32_,(undefined1  [32])kk1_inner_arrays_simd);
  auVar53 = vmulps_avx512vl(auVar78._0_32_,(undefined1  [32])kk2_inner_arrays_simd);
  auVar54 = vpbroadcastd_avx512vl();
  auVar43._0_4_ = (float)auVar38._0_8_;
  auVar43._4_12_ = auVar38._4_12_;
  auVar38 = vsubss_avx512f(auVar43,auVar37);
  auVar55 = vmulps_avx512vl(auVar78._0_32_,(undefined1  [32])kk0_inner_arrays_simd);
  fVar75 = (float)auVar39._0_8_ - auVar37._0_4_;
  auVar58._0_4_ = auVar52._0_4_ + fVar75;
  auVar58._4_4_ = auVar52._4_4_ + fVar75;
  auVar58._8_4_ = auVar52._8_4_ + fVar75;
  auVar58._12_4_ = auVar52._12_4_ + fVar75;
  auVar58._16_4_ = auVar52._16_4_ + fVar75;
  auVar58._20_4_ = auVar52._20_4_ + fVar75;
  auVar58._24_4_ = auVar52._24_4_ + fVar75;
  auVar58._28_4_ = auVar52._28_4_ + fVar75;
  auVar52 = vcvtps2dq_avx(auVar58);
  auVar57._0_4_ = auVar55._0_4_ + fVar75;
  auVar57._4_4_ = auVar55._4_4_ + fVar75;
  auVar57._8_4_ = auVar55._8_4_ + fVar75;
  auVar57._12_4_ = auVar55._12_4_ + fVar75;
  auVar57._16_4_ = auVar55._16_4_ + fVar75;
  auVar57._20_4_ = auVar55._20_4_ + fVar75;
  auVar57._24_4_ = auVar55._24_4_ + fVar75;
  auVar57._28_4_ = auVar55._28_4_ + fVar75;
  auVar56._0_4_ = auVar53._0_4_ + fVar75;
  auVar56._4_4_ = auVar53._4_4_ + fVar75;
  auVar56._8_4_ = auVar53._8_4_ + fVar75;
  auVar56._12_4_ = auVar53._12_4_ + fVar75;
  auVar56._16_4_ = auVar53._16_4_ + fVar75;
  auVar56._20_4_ = auVar53._20_4_ + fVar75;
  auVar56._24_4_ = auVar53._24_4_ + fVar75;
  auVar56._28_4_ = auVar53._28_4_ + fVar75;
  auVar55 = vpaddd_avx2(auVar52,auVar77);
  auVar52 = vcvtps2dq_avx(auVar56);
  auVar53 = vcvtps2dq_avx(auVar57);
  auVar56 = vpaddd_avx512vl(auVar55,auVar54);
  auVar57 = vpaddd_avx512vl(auVar56,auVar54);
  auVar53 = vpaddd_avx512vl(auVar53,auVar77);
  auVar52 = vpaddd_avx2(auVar52,auVar77);
  auVar58 = vpaddd_avx512vl(auVar53,auVar54);
  auVar59 = vpaddd_avx512vl(auVar52,auVar54);
  auVar60 = vpaddd_avx512vl(auVar58,auVar54);
  auVar61 = vpaddd_avx512vl(auVar59,auVar54);
  iVar22 = -0xc;
  do {
    auVar39._0_4_ = (float)iVar22;
    auVar39._4_12_ = in_ZMM15._4_12_;
    auVar37 = vmovdqa64_avx512vl(auVar35);
    auVar62 = vpbroadcastd_avx512vl(ZEXT416((uint)iimage->data_width));
    auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
    auVar39 = vfmadd213ss_avx512f(auVar39,auVar51,auVar38);
    auVar37 = vpternlogd_avx512vl(auVar37,auVar39,auVar36,0xf8);
    auVar37 = vaddss_avx512f(auVar39,auVar37);
    auVar39 = vmovdqa64_avx512vl(auVar35);
    vroundss_avx(auVar37,auVar37,0xb);
    auVar37 = vcvtsi2ss_avx512f(in_ZMM17._0_16_,iVar22 + 1);
    auVar37 = vfmadd213ss_avx512f(auVar37,auVar51,auVar38);
    auVar63 = vpbroadcastd_avx512vl();
    auVar64 = vpmulld_avx512vl(auVar62,auVar63);
    auVar39 = vpternlogd_avx512vl(auVar39,auVar37,auVar36,0xf8);
    auVar37 = vaddss_avx512f(auVar37,auVar39);
    auVar65 = vpaddd_avx512vl(auVar63,auVar54);
    auVar66 = vpmulld_avx512vl(auVar62,auVar65);
    auVar67 = vpaddd_avx512vl(auVar65,auVar54);
    in_ZMM17 = ZEXT3264(auVar67);
    auVar68 = vpaddd_avx512vl(auVar64,auVar53);
    auVar69 = vpaddd_avx512vl(auVar64,auVar58);
    vpaddd_avx512vl(auVar64,auVar60);
    auVar62 = vpmulld_avx512vl(auVar62,auVar67);
    auVar80 = vgatherdps(ZEXT832(0) << 0x40,auVar77);
    auVar77 = vpcmpeqd_avx2(auVar68,auVar68);
    auVar37 = vroundss_avx(auVar37,auVar37,0xb);
    in_ZMM15 = ZEXT1664(auVar37);
    vpaddd_avx512vl(auVar66,auVar53);
    auVar64 = vpaddd_avx512vl(auVar66,auVar60);
    vpaddd_avx512vl(auVar62,auVar53);
    vpaddd_avx512vl(auVar62,auVar58);
    auVar68 = vpaddd_avx512vl(auVar62,auVar60);
    auVar82 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2(auVar69,auVar69);
    auVar70 = vpbroadcastd_avx512vl();
    auVar71 = vpaddd_avx512vl(auVar70,auVar54);
    auVar72 = vpaddd_avx512vl(auVar71,auVar54);
    auVar66 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar62 = vpcmpeqd_avx2(auVar64,auVar64);
    auVar77 = vsubps_avx(auVar69,auVar77);
    auVar62 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar62);
    auVar64 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar62 = vsubps_avx(auVar62,auVar66);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar64);
    auVar66 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vsubps_avx(auVar82,auVar64);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar66);
    auVar69 = vpcmpeqd_avx2(auVar68,auVar68);
    auVar66 = vsubps_avx(auVar66,auVar80);
    auVar68 = vsubps_avx(auVar66,auVar62);
    pfVar28 = (float *)((long)pfVar23 + lVar18 + -0xa0);
    *pfVar28 = auVar64._0_4_ + auVar64._0_4_ + auVar62._0_4_ + auVar66._0_4_;
    pfVar28[1] = auVar64._4_4_ + auVar64._4_4_ + auVar62._4_4_ + auVar66._4_4_;
    pfVar28[2] = auVar64._8_4_ + auVar64._8_4_ + auVar62._8_4_ + auVar66._8_4_;
    pfVar28[3] = auVar64._12_4_ + auVar64._12_4_ + auVar62._12_4_ + auVar66._12_4_;
    pfVar28[4] = auVar64._16_4_ + auVar64._16_4_ + auVar62._16_4_ + auVar66._16_4_;
    pfVar28[5] = auVar64._20_4_ + auVar64._20_4_ + auVar62._20_4_ + auVar66._20_4_;
    pfVar28[6] = auVar64._24_4_ + auVar64._24_4_ + auVar62._24_4_ + auVar66._24_4_;
    pfVar28[7] = auVar64._28_4_ + auVar64._28_4_ + auVar62._28_4_ + auVar66._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18 + -0xa0);
    *pfVar28 = auVar77._0_4_ + auVar77._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar77._4_4_ + auVar77._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar77._8_4_ + auVar77._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar77._12_4_ + auVar77._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar77._16_4_ + auVar77._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar77._20_4_ + auVar77._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar77._24_4_ + auVar77._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar77._28_4_ + auVar77._28_4_ + auVar68._28_4_;
    iVar1 = iimage->data_width;
    auVar64._4_4_ = iVar1;
    auVar64._0_4_ = iVar1;
    auVar64._8_4_ = iVar1;
    auVar64._12_4_ = iVar1;
    auVar64._16_4_ = iVar1;
    auVar64._20_4_ = iVar1;
    auVar64._24_4_ = iVar1;
    auVar64._28_4_ = iVar1;
    auVar77 = vpmulld_avx512vl(auVar64,auVar70);
    auVar62 = vpmulld_avx512vl(auVar64,auVar71);
    auVar64 = vpmulld_avx512vl(auVar64,auVar72);
    auVar66 = vpaddd_avx512vl(auVar77,auVar53);
    vpaddd_avx512vl(auVar77,auVar58);
    auVar77 = vpaddd_avx2(auVar60,auVar77);
    vpaddd_avx512vl(auVar62,auVar53);
    vpaddd_avx2(auVar60,auVar62);
    vpaddd_avx512vl(auVar64,auVar53);
    vpaddd_avx512vl(auVar64,auVar58);
    vpaddd_avx2(auVar60,auVar64);
    auVar82 = vgatherdps(ZEXT832(0) << 0x20,auVar69);
    auVar62 = vpcmpeqd_avx2(auVar66,auVar66);
    auVar69 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
    auVar64 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vsubps_avx(auVar64,auVar77);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar68 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar80 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vsubps_avx(auVar64,auVar66);
    auVar64 = vsubps_avx(auVar69,auVar68);
    auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
    auVar66 = vsubps_avx(auVar80,auVar82);
    auVar68 = vsubps_avx(auVar66,auVar62);
    pfVar28 = (float *)((long)pfVar23 + lVar18 + -0x40);
    *pfVar28 = auVar64._0_4_ + auVar64._0_4_ + auVar62._0_4_ + auVar66._0_4_;
    pfVar28[1] = auVar64._4_4_ + auVar64._4_4_ + auVar62._4_4_ + auVar66._4_4_;
    pfVar28[2] = auVar64._8_4_ + auVar64._8_4_ + auVar62._8_4_ + auVar66._8_4_;
    pfVar28[3] = auVar64._12_4_ + auVar64._12_4_ + auVar62._12_4_ + auVar66._12_4_;
    pfVar28[4] = auVar64._16_4_ + auVar64._16_4_ + auVar62._16_4_ + auVar66._16_4_;
    pfVar28[5] = auVar64._20_4_ + auVar64._20_4_ + auVar62._20_4_ + auVar66._20_4_;
    pfVar28[6] = auVar64._24_4_ + auVar64._24_4_ + auVar62._24_4_ + auVar66._24_4_;
    pfVar28[7] = auVar64._28_4_ + auVar64._28_4_ + auVar62._28_4_ + auVar66._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18 + -0x40);
    *pfVar28 = auVar77._0_4_ + auVar77._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar77._4_4_ + auVar77._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar77._8_4_ + auVar77._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar77._12_4_ + auVar77._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar77._16_4_ + auVar77._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar77._20_4_ + auVar77._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar77._24_4_ + auVar77._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar77._28_4_ + auVar77._28_4_ + auVar68._28_4_;
    iVar1 = iimage->data_width;
    auVar77._4_4_ = iVar1;
    auVar77._0_4_ = iVar1;
    auVar77._8_4_ = iVar1;
    auVar77._12_4_ = iVar1;
    auVar77._16_4_ = iVar1;
    auVar77._20_4_ = iVar1;
    auVar77._24_4_ = iVar1;
    auVar77._28_4_ = iVar1;
    auVar62 = vpmulld_avx512vl(auVar77,auVar63);
    auVar64 = vpmulld_avx512vl(auVar77,auVar65);
    auVar66 = vpmulld_avx512vl(auVar77,auVar67);
    auVar77 = vpaddd_avx2(auVar55,auVar62);
    vpaddd_avx512vl(auVar62,auVar56);
    auVar62 = vpaddd_avx2(auVar57,auVar62);
    vpaddd_avx2(auVar55,auVar64);
    vpaddd_avx2(auVar57,auVar64);
    vpaddd_avx2(auVar55,auVar66);
    vpaddd_avx512vl(auVar66,auVar56);
    vpaddd_avx2(auVar57,auVar66);
    auVar82 = vgatherdps(ZEXT832(0) << 0x20,auVar69);
    auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
    auVar69 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar77 = vpcmpeqd_avx2(auVar62,auVar62);
    auVar64 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vsubps_avx(auVar64,auVar77);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar68 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar80 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vsubps_avx(auVar64,auVar66);
    auVar64 = vsubps_avx(auVar69,auVar68);
    auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
    auVar66 = vsubps_avx(auVar80,auVar82);
    auVar68 = vsubps_avx(auVar66,auVar62);
    pfVar28 = (float *)((long)pfVar23 + lVar18 + -0x80);
    *pfVar28 = auVar64._0_4_ + auVar64._0_4_ + auVar62._0_4_ + auVar66._0_4_;
    pfVar28[1] = auVar64._4_4_ + auVar64._4_4_ + auVar62._4_4_ + auVar66._4_4_;
    pfVar28[2] = auVar64._8_4_ + auVar64._8_4_ + auVar62._8_4_ + auVar66._8_4_;
    pfVar28[3] = auVar64._12_4_ + auVar64._12_4_ + auVar62._12_4_ + auVar66._12_4_;
    pfVar28[4] = auVar64._16_4_ + auVar64._16_4_ + auVar62._16_4_ + auVar66._16_4_;
    pfVar28[5] = auVar64._20_4_ + auVar64._20_4_ + auVar62._20_4_ + auVar66._20_4_;
    pfVar28[6] = auVar64._24_4_ + auVar64._24_4_ + auVar62._24_4_ + auVar66._24_4_;
    pfVar28[7] = auVar64._28_4_ + auVar64._28_4_ + auVar62._28_4_ + auVar66._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18 + -0x80);
    *pfVar28 = auVar77._0_4_ + auVar77._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar77._4_4_ + auVar77._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar77._8_4_ + auVar77._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar77._12_4_ + auVar77._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar77._16_4_ + auVar77._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar77._20_4_ + auVar77._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar77._24_4_ + auVar77._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar77._28_4_ + auVar77._28_4_ + auVar68._28_4_;
    iVar1 = iimage->data_width;
    auVar66._4_4_ = iVar1;
    auVar66._0_4_ = iVar1;
    auVar66._8_4_ = iVar1;
    auVar66._12_4_ = iVar1;
    auVar66._16_4_ = iVar1;
    auVar66._20_4_ = iVar1;
    auVar66._24_4_ = iVar1;
    auVar66._28_4_ = iVar1;
    auVar62 = vpmulld_avx512vl(auVar66,auVar70);
    auVar64 = vpmulld_avx512vl(auVar66,auVar71);
    auVar66 = vpmulld_avx512vl(auVar66,auVar72);
    auVar77 = vpaddd_avx2(auVar55,auVar62);
    vpaddd_avx512vl(auVar62,auVar56);
    auVar62 = vpaddd_avx2(auVar57,auVar62);
    vpaddd_avx2(auVar55,auVar64);
    vpaddd_avx2(auVar57,auVar64);
    vpaddd_avx2(auVar55,auVar66);
    vpaddd_avx512vl(auVar66,auVar56);
    vpaddd_avx2(auVar57,auVar66);
    auVar82 = vgatherdps(ZEXT832(0) << 0x20,auVar69);
    auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
    auVar69 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar77 = vpcmpeqd_avx2(auVar62,auVar62);
    auVar64 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vsubps_avx(auVar64,auVar77);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar68 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar80 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vsubps_avx(auVar64,auVar66);
    auVar64 = vsubps_avx(auVar69,auVar68);
    auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
    auVar66 = vsubps_avx(auVar80,auVar82);
    auVar68 = vsubps_avx(auVar66,auVar62);
    pfVar28 = (float *)((long)pfVar23 + lVar18 + -0x20);
    *pfVar28 = auVar64._0_4_ + auVar64._0_4_ + auVar62._0_4_ + auVar66._0_4_;
    pfVar28[1] = auVar64._4_4_ + auVar64._4_4_ + auVar62._4_4_ + auVar66._4_4_;
    pfVar28[2] = auVar64._8_4_ + auVar64._8_4_ + auVar62._8_4_ + auVar66._8_4_;
    pfVar28[3] = auVar64._12_4_ + auVar64._12_4_ + auVar62._12_4_ + auVar66._12_4_;
    pfVar28[4] = auVar64._16_4_ + auVar64._16_4_ + auVar62._16_4_ + auVar66._16_4_;
    pfVar28[5] = auVar64._20_4_ + auVar64._20_4_ + auVar62._20_4_ + auVar66._20_4_;
    pfVar28[6] = auVar64._24_4_ + auVar64._24_4_ + auVar62._24_4_ + auVar66._24_4_;
    pfVar28[7] = auVar64._28_4_ + auVar64._28_4_ + auVar62._28_4_ + auVar66._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18 + -0x20);
    *pfVar28 = auVar77._0_4_ + auVar77._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar77._4_4_ + auVar77._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar77._8_4_ + auVar77._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar77._12_4_ + auVar77._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar77._16_4_ + auVar77._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar77._20_4_ + auVar77._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar77._24_4_ + auVar77._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar77._28_4_ + auVar77._28_4_ + auVar68._28_4_;
    iVar1 = iimage->data_width;
    auVar68._4_4_ = iVar1;
    auVar68._0_4_ = iVar1;
    auVar68._8_4_ = iVar1;
    auVar68._12_4_ = iVar1;
    auVar68._16_4_ = iVar1;
    auVar68._20_4_ = iVar1;
    auVar68._24_4_ = iVar1;
    auVar68._28_4_ = iVar1;
    auVar62 = vpmulld_avx512vl(auVar68,auVar63);
    auVar64 = vpmulld_avx512vl(auVar68,auVar65);
    auVar66 = vpmulld_avx512vl(auVar68,auVar67);
    auVar77 = vpaddd_avx2(auVar52,auVar62);
    vpaddd_avx512vl(auVar62,auVar59);
    auVar62 = vpaddd_avx2(auVar61,auVar62);
    vpaddd_avx2(auVar52,auVar64);
    vpaddd_avx2(auVar61,auVar64);
    vpaddd_avx2(auVar52,auVar66);
    vpaddd_avx512vl(auVar66,auVar59);
    vpaddd_avx2(auVar61,auVar66);
    auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar69);
    auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
    auVar69 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar77 = vpcmpeqd_avx2(auVar62,auVar62);
    auVar64 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar77);
    auVar77 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar77);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar77 = vsubps_avx(auVar64,auVar77);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar68 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vsubps_avx(auVar64,auVar66);
    auVar64 = vsubps_avx(auVar69,auVar68);
    auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
    auVar66 = vsubps_avx(auVar63,auVar65);
    auVar68 = vsubps_avx(auVar66,auVar62);
    pfVar28 = (float *)((long)pfVar23 + lVar18 + -0x60);
    *pfVar28 = auVar64._0_4_ + auVar64._0_4_ + auVar62._0_4_ + auVar66._0_4_;
    pfVar28[1] = auVar64._4_4_ + auVar64._4_4_ + auVar62._4_4_ + auVar66._4_4_;
    pfVar28[2] = auVar64._8_4_ + auVar64._8_4_ + auVar62._8_4_ + auVar66._8_4_;
    pfVar28[3] = auVar64._12_4_ + auVar64._12_4_ + auVar62._12_4_ + auVar66._12_4_;
    pfVar28[4] = auVar64._16_4_ + auVar64._16_4_ + auVar62._16_4_ + auVar66._16_4_;
    pfVar28[5] = auVar64._20_4_ + auVar64._20_4_ + auVar62._20_4_ + auVar66._20_4_;
    pfVar28[6] = auVar64._24_4_ + auVar64._24_4_ + auVar62._24_4_ + auVar66._24_4_;
    pfVar28[7] = auVar64._28_4_ + auVar64._28_4_ + auVar62._28_4_ + auVar66._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18 + -0x60);
    *pfVar28 = auVar77._0_4_ + auVar77._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar77._4_4_ + auVar77._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar77._8_4_ + auVar77._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar77._12_4_ + auVar77._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar77._16_4_ + auVar77._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar77._20_4_ + auVar77._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar77._24_4_ + auVar77._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar77._28_4_ + auVar77._28_4_ + auVar68._28_4_;
    iVar1 = iimage->data_width;
    auVar62._4_4_ = iVar1;
    auVar62._0_4_ = iVar1;
    auVar62._8_4_ = iVar1;
    auVar62._12_4_ = iVar1;
    auVar62._16_4_ = iVar1;
    auVar62._20_4_ = iVar1;
    auVar62._24_4_ = iVar1;
    auVar62._28_4_ = iVar1;
    auVar77 = vpmulld_avx512vl(auVar62,auVar70);
    auVar66 = vpmulld_avx512vl(auVar62,auVar71);
    auVar68 = vpmulld_avx512vl(auVar62,auVar72);
    auVar62 = vpaddd_avx2(auVar52,auVar77);
    vpaddd_avx512vl(auVar77,auVar59);
    auVar64 = vpaddd_avx2(auVar61,auVar77);
    vpaddd_avx2(auVar52,auVar66);
    vpaddd_avx2(auVar61,auVar66);
    vpaddd_avx2(auVar52,auVar68);
    vpaddd_avx512vl(auVar68,auVar59);
    vpaddd_avx2(auVar61,auVar68);
    auVar77 = vgatherdps(ZEXT832(0) << 0x20,auVar69);
    auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
    auVar65 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar68 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar62 = vpcmpeqd_avx2(auVar64,auVar64);
    auVar66 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar62);
    auVar62 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar62 = vgatherdps(ZEXT832(0) << 0x20,auVar62);
    auVar64 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar62 = vsubps_avx(auVar66,auVar62);
    auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar64);
    auVar64 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar64);
    auVar64 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar64);
    auVar64 = vsubps_avx(auVar66,auVar68);
    auVar66 = vsubps_avx(auVar65,auVar69);
    auVar68 = vsubps_avx(auVar63,auVar77);
    auVar69 = vsubps_avx(auVar68,auVar64);
    pfVar28 = (float *)((long)pfVar23 + lVar18);
    *pfVar28 = auVar66._0_4_ + auVar66._0_4_ + auVar64._0_4_ + auVar68._0_4_;
    pfVar28[1] = auVar66._4_4_ + auVar66._4_4_ + auVar64._4_4_ + auVar68._4_4_;
    pfVar28[2] = auVar66._8_4_ + auVar66._8_4_ + auVar64._8_4_ + auVar68._8_4_;
    pfVar28[3] = auVar66._12_4_ + auVar66._12_4_ + auVar64._12_4_ + auVar68._12_4_;
    pfVar28[4] = auVar66._16_4_ + auVar66._16_4_ + auVar64._16_4_ + auVar68._16_4_;
    pfVar28[5] = auVar66._20_4_ + auVar66._20_4_ + auVar64._20_4_ + auVar68._20_4_;
    pfVar28[6] = auVar66._24_4_ + auVar66._24_4_ + auVar64._24_4_ + auVar68._24_4_;
    pfVar28[7] = auVar66._28_4_ + auVar66._28_4_ + auVar64._28_4_ + auVar68._28_4_;
    pfVar28 = (float *)((long)pfVar31 + lVar18);
    *pfVar28 = auVar62._0_4_ + auVar62._0_4_ + auVar69._0_4_;
    pfVar28[1] = auVar62._4_4_ + auVar62._4_4_ + auVar69._4_4_;
    pfVar28[2] = auVar62._8_4_ + auVar62._8_4_ + auVar69._8_4_;
    pfVar28[3] = auVar62._12_4_ + auVar62._12_4_ + auVar69._12_4_;
    pfVar28[4] = auVar62._16_4_ + auVar62._16_4_ + auVar69._16_4_;
    pfVar28[5] = auVar62._20_4_ + auVar62._20_4_ + auVar69._20_4_;
    pfVar28[6] = auVar62._24_4_ + auVar62._24_4_ + auVar69._24_4_;
    pfVar28[7] = auVar62._28_4_ + auVar62._28_4_ + auVar69._28_4_;
    lVar18 = lVar18 + 0x180;
    bVar2 = iVar22 < 8;
    iVar22 = iVar22 + 4;
  } while (bVar2);
  auVar37 = vmulss_avx512f(auVar51,ZEXT416(0x3f000000));
  auVar38 = vmovdqa64_avx512vl(auVar35);
  auVar39 = vmovdqa64_avx512vl(auVar35);
  auVar41 = vmovdqa64_avx512vl(auVar35);
  auVar42 = vmovdqa64_avx512vl(auVar35);
  auVar43 = vmovdqa64_avx512vl(auVar35);
  auVar44 = vmovdqa64_avx512vl(auVar35);
  auVar45 = vmovdqa64_avx512vl(auVar35);
  auVar46 = vmovdqa64_avx512vl(auVar35);
  auVar47 = vmovdqa64_avx512vl(auVar35);
  auVar48 = vmovdqa64_avx512vl(auVar35);
  auVar40 = vdivss_avx512f(SUB6416(ZEXT464(0xbda3d70a),0),auVar40);
  auVar49 = vmovdqa64_avx512vl(auVar35);
  auVar49 = vpternlogd_avx512vl(auVar49,auVar37,auVar36,0xf8);
  auVar50 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar37 = ZEXT416((uint)(auVar37._0_4_ + auVar49._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  fVar76 = auVar40._0_4_;
  auVar38 = vpternlogd_avx512vl(auVar38,auVar50,auVar36,0xf8);
  auVar40 = vmulss_avx512f(auVar51,ZEXT416(0x40200000));
  auVar38 = ZEXT416((uint)(auVar50._0_4_ + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar39,auVar40,auVar36,0xf8);
  auVar49 = vmulss_avx512f(auVar51,ZEXT416(0x40600000));
  auVar39 = ZEXT416((uint)(auVar40._0_4_ + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  fVar79 = auVar39._0_4_;
  fVar75 = fVar79 + auVar38._0_4_;
  auVar39 = vpternlogd_avx512vl(auVar41,auVar49,auVar36,0xf8);
  auVar40 = vmulss_avx512f(auVar51,ZEXT416(0x40900000));
  auVar39 = ZEXT416((uint)(auVar49._0_4_ + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar41 = vpternlogd_avx512vl(auVar42,auVar40,auVar36,0xf8);
  auVar42 = vmulss_avx512f(auVar51,ZEXT416(0x40b00000));
  auVar40 = ZEXT416((uint)(auVar41._0_4_ + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar43,auVar42,auVar36,0xf8);
  auVar43 = vmulss_avx512f(auVar51,ZEXT416(0x40d00000));
  auVar41 = ZEXT416((uint)(auVar42._0_4_ + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar44,auVar43,auVar36,0xf8);
  auVar44 = vmulss_avx512f(auVar51,ZEXT416(0x40f00000));
  auVar42 = ZEXT416((uint)(auVar43._0_4_ + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar45,auVar44,auVar36,0xf8);
  auVar45 = vmulss_avx512f(auVar51,ZEXT416(0x41080000));
  auVar43 = ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar46,auVar45,auVar36,0xf8);
  auVar46 = vmulss_avx512f(auVar51,ZEXT416(0x41180000));
  auVar44 = ZEXT416((uint)(auVar45._0_4_ + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar47,auVar46,auVar36,0xf8);
  auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x41280000));
  auVar45 = ZEXT416((uint)(auVar46._0_4_ + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar48,auVar47,auVar36,0xf8);
  fVar3 = fVar79 + auVar37._0_4_;
  fVar4 = fVar79 - auVar37._0_4_;
  auVar37 = ZEXT416((uint)(auVar47._0_4_ + auVar46._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar51 = vmulss_avx512f(auVar51,ZEXT416(0x41380000));
  fVar5 = fVar79 - auVar38._0_4_;
  fVar6 = fVar79 - auVar39._0_4_;
  fVar7 = fVar79 - auVar41._0_4_;
  fVar8 = fVar79 - auVar40._0_4_;
  fVar81 = auVar43._0_4_;
  fVar9 = fVar81 - auVar39._0_4_;
  fVar79 = fVar79 - auVar42._0_4_;
  fVar10 = fVar81 - auVar40._0_4_;
  fVar11 = fVar81 - auVar41._0_4_;
  fVar12 = fVar81 - auVar42._0_4_;
  auVar38 = vpternlogd_avx512vl(auVar35,auVar51,auVar36,0xf8);
  auVar38 = vaddss_avx512f(auVar51,auVar38);
  fVar13 = fVar81 - auVar44._0_4_;
  fVar14 = fVar81 - auVar45._0_4_;
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  fVar15 = fVar81 - auVar37._0_4_;
  fVar81 = fVar81 - auVar38._0_4_;
  gauss_s1_c0[0] = expf(fVar76 * fVar75 * fVar75);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar76);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar76);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar76);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar76);
  gauss_s1_c0[6] = expf(fVar8 * fVar8 * fVar76);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar76);
  gauss_s1_c0[8] = expf(fVar79 * fVar79 * fVar76);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar76);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar76);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar76);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar76);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar76);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar76);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar76);
  gauss_s1_c1[8] = expf(fVar81 * fVar81 * fVar76);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  uVar27 = 0xfffffff8;
  fVar75 = 0.0;
  lVar18 = 0;
  local_84 = 0;
  pfVar23 = haarResponseX;
  pfVar31 = haarResponseY;
  do {
    uVar26 = (uint)uVar27;
    pfVar28 = gauss_s1_c0;
    lVar30 = (long)local_84;
    lVar18 = (long)(int)lVar18;
    uVar20 = 0xfffffff8;
    if (uVar26 == 7) {
      pfVar28 = gauss_s1_c1;
    }
    if (uVar26 == 0xfffffff8) {
      pfVar28 = gauss_s1_c1;
    }
    uVar29 = 0;
    local_84 = local_84 + 4;
    pfVar24 = pfVar23;
    pfVar32 = pfVar31;
    do {
      pfVar25 = gauss_s1_c0;
      auVar78 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar20 == 7) {
        pfVar25 = gauss_s1_c1;
      }
      if (uVar20 == 0xfffffff8) {
        pfVar25 = gauss_s1_c1;
      }
      uVar19 = (ulong)(uVar20 >> 0x1c & 0xfffffff8);
      uVar16 = uVar29;
      pfVar21 = pfVar24;
      pfVar33 = pfVar32;
      do {
        lVar17 = 0;
        pfVar34 = (float *)((long)pfVar28 + (ulong)(uint)((int)(uVar27 >> 0x1f) << 5));
        do {
          fVar3 = pfVar25[uVar19] * *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar26 >> 0x1f) * 2 + -1;
          auVar37 = vinsertps_avx(ZEXT416((uint)pfVar33[lVar17]),ZEXT416((uint)pfVar21[lVar17]),0x10
                                 );
          lVar17 = lVar17 + 1;
          auVar36._0_4_ = fVar3 * auVar37._0_4_;
          auVar36._4_4_ = fVar3 * auVar37._4_4_;
          auVar36._8_4_ = fVar3 * auVar37._8_4_;
          auVar36._12_4_ = fVar3 * auVar37._12_4_;
          auVar37 = vandps_avx(auVar36,auVar38);
          auVar37 = vmovlhps_avx(auVar36,auVar37);
          auVar35._0_4_ = auVar78._0_4_ + auVar37._0_4_;
          auVar35._4_4_ = auVar78._4_4_ + auVar37._4_4_;
          auVar35._8_4_ = auVar78._8_4_ + auVar37._8_4_;
          auVar35._12_4_ = auVar78._12_4_ + auVar37._12_4_;
          auVar78 = ZEXT1664(auVar35);
        } while (lVar17 != 9);
        uVar16 = uVar16 + 0x18;
        uVar19 = uVar19 + (ulong)(-1 < (int)uVar20) * 2 + -1;
        pfVar21 = pfVar21 + 0x18;
        pfVar33 = pfVar33 + 0x18;
      } while (uVar16 < uVar20 * 0x18 + 0x198);
      uVar20 = uVar20 + 5;
      uVar29 = uVar29 + 0x78;
      fVar3 = gauss_s2_arr[lVar30];
      auVar40._4_4_ = fVar3;
      auVar40._0_4_ = fVar3;
      auVar40._8_4_ = fVar3;
      auVar40._12_4_ = fVar3;
      auVar36 = vmulps_avx512vl(auVar35,auVar40);
      lVar30 = lVar30 + 1;
      pfVar24 = pfVar24 + 0x78;
      pfVar32 = pfVar32 + 0x78;
      auVar51._0_4_ = auVar36._0_4_ * auVar36._0_4_;
      auVar51._4_4_ = auVar36._4_4_ * auVar36._4_4_;
      auVar51._8_4_ = auVar36._8_4_ * auVar36._8_4_;
      auVar51._12_4_ = auVar36._12_4_ * auVar36._12_4_;
      auVar39 = vshufpd_avx(auVar36,auVar36,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar18) = auVar36;
      lVar18 = lVar18 + 4;
      auVar37 = vmovshdup_avx(auVar51);
      auVar35 = vfmadd231ss_fma(auVar37,auVar36,auVar36);
      auVar37 = vshufps_avx(auVar36,auVar36,0xff);
      auVar39 = vfmadd213ss_fma(auVar39,auVar39,auVar35);
      auVar37 = vfmadd213ss_fma(auVar37,auVar37,auVar39);
      fVar75 = fVar75 + auVar37._0_4_;
    } while (local_84 != (int)lVar30);
    pfVar23 = pfVar23 + 5;
    pfVar31 = pfVar31 + 5;
    uVar27 = (ulong)(uVar26 + 5);
  } while ((int)uVar26 < 3);
  if (fVar75 < 0.0) {
    fVar75 = sqrtf(fVar75);
  }
  else {
    auVar37 = vsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
    fVar75 = auVar37._0_4_;
  }
  lVar18 = 0;
  auVar78 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar75)));
  do {
    auVar74 = vmulps_avx512f(auVar78,*(undefined1 (*) [64])(ipoint->descriptor + lVar18));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar18) = auVar74;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_simd_2_24_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
   
        __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
        __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
        __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

        __m256 ipoint_x_sub_int_scale_vec = _mm256_set1_ps((float) ipoint_x_sub_int_scale);

        // USE CVTTPS_EPI32 FOR TRUNCATION!!!
        __m256i sample_col1 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks1));
        __m256i sample_col0 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks0));
        __m256i sample_col2 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks2));

        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {

            int l_count1 = l_count + 1;

            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale + l * scale);
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale + (l+1) * scale);  

            __m256i sample_y_sub_int_scale_vec0 = _mm256_set1_epi32(sample_y_sub_int_scale0);
            __m256i sample_y_sub_int_scale_vec1 = _mm256_set1_epi32(sample_y_sub_int_scale1);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col0, int_scale_vec, &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col0, int_scale_vec, &haarResponseX[l_count1*24+0], &haarResponseY[l_count1*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col1, int_scale_vec, &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col1, int_scale_vec, &haarResponseX[l_count1*24+8], &haarResponseY[l_count1*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col2, int_scale_vec, &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col2, int_scale_vec, &haarResponseX[l_count1*24+16], &haarResponseY[l_count1*24+16]);
        }



    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}